

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O1

int __thiscall HevcUnit::serializeBuffer(HevcUnit *this,uint8_t *dstBuffer,uint8_t *dstEnd)

{
  int iVar1;
  
  if ((long)this->m_nalBufferLen != 0) {
    iVar1 = NALUnit::encodeNAL(this->m_nalBuffer,this->m_nalBuffer + this->m_nalBufferLen,dstBuffer,
                               (long)dstEnd - (long)dstBuffer);
    return iVar1;
  }
  return 0;
}

Assistant:

int HevcUnit::serializeBuffer(uint8_t* dstBuffer, const uint8_t* dstEnd) const
{
    if (m_nalBufferLen == 0)
        return 0;
    const int encodeRez = NALUnit::encodeNAL(m_nalBuffer, m_nalBuffer + m_nalBufferLen, dstBuffer, dstEnd - dstBuffer);
    if (encodeRez == -1)
        return -1;
    return encodeRez;
}